

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
slice_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::select(slice_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  long lVar1;
  supertype *psVar2;
  fd_set *pfVar3;
  path_node_type *ppVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar5;
  uint uVar6;
  int64_t i;
  fd_set *pfVar7;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
  *this_00;
  int64_t i_1;
  fd_set *i_00;
  fd_set *pfVar8;
  long lVar9;
  uint in_stack_00000008;
  basic_path_node<char> *local_48;
  fd_set *local_40;
  fd_set *local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  pfVar3 = __exceptfds;
  while (uVar6 = (byte)pfVar3->fds_bits[0] & 0xf, uVar6 - 8 < 2) {
    pfVar3 = (fd_set *)pfVar3->fds_bits[1];
  }
  if (uVar6 == 0xe) {
    local_38 = __readfds;
    pfVar3 = (fd_set *)
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)__exceptfds);
    if ((this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar9 = (this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      i_00 = (fd_set *)((lVar9 >> 0x3f & (ulong)pfVar3) + lVar9);
      if ((long)pfVar3 <= (long)i_00) {
        i_00 = pfVar3;
      }
    }
    else {
      i_00 = (fd_set *)((this->slice_).step_ >> 0x3f & (ulong)pfVar3);
    }
    pfVar3 = (fd_set *)
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)__exceptfds);
    if ((this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      lVar9 = (this->slice_).step_;
      pfVar8 = (fd_set *)((lVar1 >> 0x3f & (ulong)pfVar3) + lVar1);
      if ((long)pfVar3 <= (long)pfVar8) {
        pfVar8 = pfVar3;
      }
    }
    else {
      lVar9 = (this->slice_).step_;
      pfVar8 = (fd_set *)0xffffffffffffffff;
      if (-1 < lVar9) {
        pfVar8 = pfVar3;
      }
    }
    if (lVar9 < 1) {
      if (lVar9 < 0) {
        pfVar3 = (fd_set *)
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)__exceptfds);
        if ((long)pfVar3 <= (long)i_00) {
          pfVar3 = (fd_set *)
                   basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                             ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                               *)__exceptfds);
          i_00 = (fd_set *)((long)pfVar3[-1].fds_bits + 0x7f);
        }
        pfVar7 = (fd_set *)0xffffffffffffffff;
        if (-1 < (long)pfVar8) {
          pfVar7 = pfVar8;
        }
        if ((long)pfVar7 < (long)i_00) {
          do {
            pfVar3 = (fd_set *)
                     basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)__exceptfds);
            if (i_00 < pfVar3) {
              ppVar4 = (path_node_type *)__writefds;
              local_40 = i_00;
              if ((in_stack_00000008 & 0xb) != 0) {
                local_48 = (basic_path_node<char> *)__writefds;
                ppVar4 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                         ::
                         create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                                   (this_00,&local_48,(unsigned_long *)&local_40);
              }
              pbVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       at((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)__exceptfds,(size_t)i_00);
              psVar2 = (this->
                       super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                       ).tail_;
              if (psVar2 == (supertype *)0x0) {
                pfVar3 = (fd_set *)(**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar4,pbVar5);
              }
              else {
                uVar6 = (*psVar2->_vptr_jsonpath_selector[2])
                                  (psVar2,this_00,local_38,ppVar4,pbVar5,__timeout,in_stack_00000008
                                  );
                pfVar3 = (fd_set *)(ulong)uVar6;
              }
            }
            i_00 = (fd_set *)((long)i_00->fds_bits + lVar9);
          } while ((long)pfVar7 < (long)i_00);
        }
      }
    }
    else {
      pfVar7 = (fd_set *)0x0;
      if (0 < (long)i_00) {
        pfVar7 = i_00;
      }
      pfVar3 = (fd_set *)
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                         ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)__exceptfds);
      if ((long)pfVar3 < (long)pfVar8) {
        pfVar3 = (fd_set *)
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)__exceptfds);
        pfVar8 = pfVar3;
      }
      if ((long)pfVar7 < (long)pfVar8) {
        do {
          ppVar4 = (path_node_type *)__writefds;
          local_40 = pfVar7;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_48 = (basic_path_node<char> *)__writefds;
            ppVar4 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                               (this_00,&local_48,(unsigned_long *)&local_40);
          }
          pbVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                               *)__exceptfds,(size_t)pfVar7);
          psVar2 = (this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                   ).tail_;
          if (psVar2 == (supertype *)0x0) {
            pfVar3 = (fd_set *)(**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar4,pbVar5);
          }
          else {
            uVar6 = (*psVar2->_vptr_jsonpath_selector[2])
                              (psVar2,this_00,local_38,ppVar4,pbVar5,__timeout,in_stack_00000008);
            pfVar3 = (fd_set *)(ulong)uVar6;
          }
          pfVar7 = (fd_set *)((long)pfVar7->fds_bits + lVar9);
        } while ((long)pfVar7 < (long)pfVar8);
      }
    }
  }
  return (int)pfVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto start = slice_.get_start(current.size());
                auto end = slice_.get_stop(current.size());
                auto step = slice_.step();

                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(current.size()))
                    {
                        end = current.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, j, options), 
                                            current[j], receiver, options);
                    }
                }
                else if (step < 0)
                {
                    if (start >= static_cast<int64_t>(current.size()))
                    {
                        start = static_cast<int64_t>(current.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        if (j < current.size())
                        {
                            this->tail_select(context, root, 
                                                path_generator_type::generate(context, last,j,options), current[j], receiver, options);
                        }
                    }
                }
            }
        }